

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void shk_chat(monst *shkp)

{
  char cVar1;
  int iVar2;
  monst *pmVar3;
  level *plVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  vptrs *pvVar11;
  long lVar12;
  char *pcVar13;
  char *line;
  
  if ((*(uint *)&shkp->field_0x60 >> 0x19 & 1) == 0) {
    pcVar8 = Monnam(shkp);
    pcVar13 = "%s asks whether you\'ve seen any untended shops recently.";
LAB_00231b5a:
    pline(pcVar13,pcVar8);
    return;
  }
  if ((*(uint *)&shkp->field_0x60 >> 0x16 & 1) == 0) {
    iVar6 = pronoun_gender(level,shkp);
    pcVar8 = genders[iVar6].he;
    iVar2._0_1_ = shkp[0x1b].mtame;
    iVar2._1_1_ = shkp[0x1b].m_ap_type;
    iVar2._2_1_ = shkp[0x1b].mfrozen;
    iVar2._3_1_ = shkp[0x1b].mblinded;
    pcVar13 = "non-paying";
    if (iVar2 == 0) {
      pcVar13 = "rude";
    }
    line = "%s mentions how much %s dislikes %s customers.";
  }
  else {
    if (*(char *)((long)&shkp[0x1b].meating + 1) != '\0') {
      iVar6 = strncmp(&shkp[0x1b].field_0x75,plname,0x20);
      pcVar8 = Hello(shkp);
      if (iVar6 == 0) {
        verbalize("%s %s!  Didn\'t you forget to pay?",pcVar8,plname);
        return;
      }
      verbalize("%s %s!  I was looking for %s.",pcVar8,plname,&shkp[0x1b].field_0x75);
      *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
      return;
    }
    if (*(short *)((long)&shkp[0x1b].misc_worn_check + 2) == 0) {
      if (*(int *)&shkp[0x1b].field_0x60 != 0) {
        iVar6 = pronoun_gender(level,shkp);
        pcVar8 = genders[iVar6].him;
        uVar7 = *(uint *)&shkp[0x1b].field_0x60;
        pcVar13 = currency((long)(int)uVar7);
        pline("%s reminds you that you owe %s %ld %s.",(undefined1 *)((long)&shkp[0x1c].minvent + 5)
              ,pcVar8,(ulong)uVar7,pcVar13);
        return;
      }
      uVar7 = shkp[0x1b].mappearance;
      if ((long)(int)uVar7 != 0) {
        pcVar8 = currency((long)(int)uVar7);
        pline("%s encourages you to use your %ld %s of credit.",
              (undefined1 *)((long)&shkp[0x1c].minvent + 5),(ulong)uVar7,pcVar8);
        return;
      }
      iVar6._0_1_ = shkp[0x1b].mtame;
      iVar6._1_1_ = shkp[0x1b].m_ap_type;
      iVar6._2_1_ = shkp[0x1b].mfrozen;
      iVar6._3_1_ = shkp[0x1b].mblinded;
      if (iVar6 == 0) {
        uVar10 = money_cnt(shkp->minvent);
        if (0x31 < (long)uVar10) {
          pcVar8 = (char *)((long)&shkp[0x1c].minvent + 5);
          if (uVar10 < 0xfa1) {
            iVar6 = strcmp(pcVar8,"Izchak");
            if (iVar6 == 0) {
              uVar7 = mt_random();
              pcVar13 = Izchak_speaks[(ulong)uVar7 % 9];
            }
            else {
              if ((urole.malenum == 0x159) && (iVar6 = inhishop(shkp), plVar4 = level, iVar6 != 0))
              {
                cVar1 = (char)shkp[0x1b].meating;
                for (lVar9 = (long)*(char *)((long)level->monsters + (long)cVar1 * 0xd8 + 0x3358);
                    lVar9 <= *(char *)((long)plVar4->monsters + (long)cVar1 * 0xd8 + 0x3359);
                    lVar9 = lVar9 + 1) {
                  for (lVar12 = (long)*(char *)((long)plVar4->monsters + (long)cVar1 * 0xd8 + 0x335a
                                               );
                      lVar12 <= *(char *)((long)plVar4->monsters + (long)cVar1 * 0xd8 + 0x335b);
                      lVar12 = lVar12 + 1) {
                    bVar5 = costly_spot((xchar)lVar9,(xchar)lVar12);
                    if (bVar5 != '\0') {
                      pvVar11 = (vptrs *)(level->objects[lVar9] + lVar12);
                      while (pmVar3 = pvVar11->v_ocarry, pmVar3 != (monst *)0x0) {
                        if (((pmVar3->mtrack[3].x & 8U) == 0) &&
                           (*(short *)((long)&pmVar3->m_id + 2) == 0x78)) {
                          pcVar13 = "%s says that he\'s selling these fine leather jackets.";
                          goto LAB_00231b5a;
                        }
                        pvVar11 = (vptrs *)&pmVar3->data;
                      }
                    }
                  }
                }
              }
              pcVar13 = "%s talks about the problem of shoplifters.";
            }
          }
          else {
            pcVar13 = "%s says that business is good.";
          }
          goto LAB_00231b5a;
        }
        pcVar13 = "%s complains that business is bad.";
      }
      else {
        pcVar13 = "%s complains about a recent robbery.";
      }
      pcVar8 = (char *)((long)&shkp[0x1c].minvent + 5);
      goto LAB_00231b5a;
    }
    lVar9 = addupbill(shkp);
    pcVar8 = (char *)(*(int *)&shkp[0x1b].field_0x60 + lVar9);
    pcVar13 = currency((long)pcVar8);
    line = "%s says that your bill comes to %ld %s.";
  }
  pline(line,(undefined1 *)((long)&shkp[0x1c].minvent + 5),pcVar8,pcVar13);
  return;
}

Assistant:

void shk_chat(struct monst *shkp)
{
	struct eshk *eshk;
	long shkmoney;
	if (!shkp->isshk) {
		/* The monster type is shopkeeper, but this monster is
		   not actually a shk, which could happen if someone
		   wishes for a shopkeeper statue and then animates it.
		   (Note: shkname() would be "" in a case like this.) */
		pline("%s asks whether you've seen any untended shops recently.",
		      Monnam(shkp));
		/* [Perhaps we ought to check whether this conversation
		   is taking place inside an untended shop, but a shopless
		   shk can probably be expected to be rather disoriented.] */
		return;
	}

	eshk = ESHK(shkp);
	if (ANGRY(shkp))
		pline("%s mentions how much %s dislikes %s customers.",
			shkname(shkp), mhe(level, shkp),
			eshk->robbed ? "non-paying" : "rude");
	else if (eshk->following) {
		if (strncmp(eshk->customer, plname, PL_NSIZ)) {
		    verbalize("%s %s!  I was looking for %s.",
			    Hello(shkp), plname, eshk->customer);
		    eshk->following = 0;
		} else {
		    verbalize("%s %s!  Didn't you forget to pay?",
			      Hello(shkp), plname);
		}
	} else if (eshk->billct) {
		long total = addupbill(shkp) + eshk->debit;
		pline("%s says that your bill comes to %ld %s.",
		      shkname(shkp), total, currency(total));
	} else if (eshk->debit)
		pline("%s reminds you that you owe %s %ld %s.",
		      shkname(shkp), mhim(level, shkp),
		      eshk->debit, currency(eshk->debit));
	else if (eshk->credit)
		pline("%s encourages you to use your %ld %s of credit.",
		      shkname(shkp), eshk->credit, currency(eshk->credit));
	else if (eshk->robbed)
		pline("%s complains about a recent robbery.", shkname(shkp));
	else if ((shkmoney = money_cnt(shkp->minvent)) < 50)
		pline("%s complains that business is bad.", shkname(shkp));
	else if (shkmoney > 4000)
		pline("%s says that business is good.", shkname(shkp));
	else if (strcmp(shkname(shkp), "Izchak") == 0)
		pline(Izchak_speaks[rn2(SIZE(Izchak_speaks))],shkname(shkp));
	else if (Role_if(PM_ARCHEOLOGIST) && inhishop(shkp) &&
		 shk_has_leather_jackets(shkp))
		pline("%s says that he's selling these fine leather jackets.",
		      shkname(shkp));
	else
		pline("%s talks about the problem of shoplifters.",shkname(shkp));
}